

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat64x2Operation::OpReciprocalSqrt(SIMDValue *value)

{
  undefined1 auVar1 [16];
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  X86SIMDValue v;
  X86SIMDValue temp;
  X86SIMDValue doubleOnes;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(value);
  doubleOnes.field_0.i64[0] = 0x3ff0000000000000;
  auVar1._8_8_ = 0x3ff0000000000000;
  auVar1._0_8_ = 0x3ff0000000000000;
  auVar1 = divpd(auVar1,(undefined1  [16])_Var2.field_0);
  register0x00001200 = sqrtpd(auVar1,auVar1);
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&doubleOnes.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpReciprocalSqrt(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue doubleOnes, temp;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        doubleOnes.m128d_value = _mm_set_pd(1.0, 1.0);
        temp.m128d_value = _mm_div_pd(doubleOnes.m128d_value, v.m128d_value); // temp = 1.0/value
        x86Result.m128d_value = _mm_sqrt_pd(temp.m128d_value); // result = sqrt(1.0/value)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }